

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O3

void __thiscall PageStack<FinalizableObject_*>::Release(PageStack<FinalizableObject_*> *this)

{
  undefined4 *puVar1;
  PagePool *this_00;
  code *pcVar2;
  bool bVar3;
  Chunk *page;
  undefined8 *in_FS_OFFSET;
  
  bVar3 = IsEmpty(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                       ,0x187,"(IsEmpty())","IsEmpty()");
    if (!bVar3) goto LAB_002d128f;
    *puVar1 = 0;
  }
  page = this->currentChunk;
  if (page != (Chunk *)0x0) {
    if (page->nextChunk != (Chunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x18c,"(currentChunk->nextChunk == nullptr)",
                         "currentChunk->nextChunk == nullptr");
      if (!bVar3) {
LAB_002d128f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      page = this->currentChunk;
    }
    this->pageCount = this->pageCount - 1;
    this_00 = this->pagePool;
    if ((page->super_PagePoolPage).isReserved == true) {
      Memory::PagePool::FreeReservedPage(this_00,&page->super_PagePoolPage);
    }
    else {
      page->nextChunk = (Chunk *)this_00->freePageList;
      this_00->freePageList = (PagePoolFreePage *)page;
    }
    this->currentChunk = (Chunk *)0x0;
  }
  this->nextEntry = (FinalizableObject **)0x0;
  this->chunkStart = (FinalizableObject **)0x0;
  this->chunkEnd = (FinalizableObject **)0x0;
  return;
}

Assistant:

void PageStack<T>::Release()
{
    Assert(IsEmpty());

    // We may have a preallocated chunk still held; if so release it.
    if (currentChunk != nullptr)
    {
        Assert(currentChunk->nextChunk == nullptr);
        FreeChunk(currentChunk);
        currentChunk = nullptr;
    }

    nextEntry = nullptr;
    chunkStart = nullptr;
    chunkEnd = nullptr;
}